

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmApi.c
# Opt level: O2

char * Nm_ManCreateUniqueName(Nm_Man_t *p,int ObjId)

{
  Nm_Entry_t *pNVar1;
  char *pcVar2;
  int iVar3;
  
  pNVar1 = Nm_ManTableLookupId(p,ObjId);
  if (pNVar1 == (Nm_Entry_t *)0x0) {
    pcVar2 = Nm_ManCreateUniqueName::NameStr;
    sprintf(Nm_ManCreateUniqueName::NameStr,"n%d",ObjId);
    iVar3 = 1;
    while( true ) {
      pNVar1 = Nm_ManTableLookupName(p,Nm_ManCreateUniqueName::NameStr,-1);
      if (pNVar1 == (Nm_Entry_t *)0x0) break;
      sprintf(Nm_ManCreateUniqueName::NameStr,"n%d_%d",ObjId,iVar3);
      iVar3 = iVar3 + 1;
    }
  }
  else {
    pcVar2 = (char *)(pNVar1 + 1);
  }
  return (char *)(Nm_Entry_t *)pcVar2;
}

Assistant:

char * Nm_ManCreateUniqueName( Nm_Man_t * p, int ObjId )
{
    static char NameStr[1000];
    Nm_Entry_t * pEntry;
    int i;
    if ( (pEntry = Nm_ManTableLookupId(p, ObjId)) )
        return pEntry->Name;
    sprintf( NameStr, "n%d", ObjId );
    for ( i = 1; Nm_ManTableLookupName(p, NameStr, -1); i++ )
        sprintf( NameStr, "n%d_%d", ObjId, i );
    return NameStr;
}